

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Calls.cpp
# Opt level: O1

PSNodesSeq * __thiscall
dg::pta::LLVMPointerGraphBuilder::createMemSet
          (PSNodesSeq *__return_storage_ptr__,LLVMPointerGraphBuilder *this,Instruction *Inst)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  undefined8 *puVar5;
  Value *val;
  PSNode *n;
  Instruction *pIVar6;
  bool bVar7;
  PSNode *op;
  PSNode *G;
  PSNode *local_48;
  PSNode *local_40;
  PSNode *local_38;
  
  uVar1 = *(uint *)(Inst + 0x14);
  pIVar6 = Inst + -(ulong)(uVar1 << 5);
  lVar3 = *(long *)(pIVar6 + 0x20);
  bVar7 = false;
  if ((lVar3 != 0) && (bVar7 = false, *(char *)(lVar3 + 0x10) == '\x10')) {
    uVar2 = *(uint *)(lVar3 + 0x20);
    if (uVar2 < 0x41) {
      bVar7 = *(long *)(lVar3 + 0x18) == 0;
    }
    else {
      uVar4 = llvm::APInt::countLeadingZerosSlowCase();
      bVar7 = uVar4 == uVar2;
    }
  }
  if (bVar7) {
    puVar5 = (undefined8 *)&NULLPTR;
  }
  else {
    puVar5 = &UNKNOWN_MEMORY;
  }
  local_40 = (PSNode *)*puVar5;
  if ((uVar1 >> 0x1e & 1) != 0) {
    pIVar6 = *(Instruction **)(Inst + -8);
  }
  val = (Value *)llvm::Value::stripInBoundsOffsets
                           (*(undefined8 *)pIVar6,
                            llvm::function_ref<void(llvm::Value_const*)>::
                            callback_fn<llvm::Value::stripInBoundsOffsets(llvm::function_ref<void(llvm::Value_const*)>)::_default_arg_1_::_lambda(llvm::Value_const*)_1_>
                            ,&local_48);
  local_48 = getOperand(this,val);
  local_38 = PointerGraph::create<(dg::pta::PSNodeType)4,dg::pta::PSNode*&,unsigned_long_const&>
                       ((PointerGraph *)this,&local_48,&Offset::UNKNOWN);
  n = PointerGraph::create<(dg::pta::PSNodeType)3,dg::pta::PSNode*&,dg::pta::PSNode*&>
                ((PointerGraph *)this,&local_40,&local_38);
  PSNodesSeq::PSNodesSeq(__return_storage_ptr__,local_38);
  PSNodesSeq::append(__return_storage_ptr__,n);
  return __return_storage_ptr__;
}

Assistant:

LLVMPointerGraphBuilder::PSNodesSeq
LLVMPointerGraphBuilder::createMemSet(const llvm::Instruction *Inst) {
    PSNode *val;
    if (llvmutils::memsetIsZeroInitialization(
                llvm::cast<llvm::IntrinsicInst>(Inst)))
        val = NULLPTR;
    else
        // if the memset is not 0-initialized, it does some
        // garbage into the pointer
        val = UNKNOWN_MEMORY;

    PSNode *op = getOperand(Inst->getOperand(0)->stripInBoundsOffsets());
    // we need to make unknown offsets
    PSNode *G = PS.create<PSNodeType::GEP>(op, Offset::UNKNOWN);
    PSNode *S = PS.create<PSNodeType::STORE>(val, G);

    PSNodesSeq ret(G);
    ret.append(S);
    // no representant here...

    return ret;
}